

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O0

void aom_highbd_quantize_b_64x64_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined8 *puVar1;
  short sVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  long lVar9;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  uint32_t abs_qcoeff;
  int64_t tmp2;
  int64_t tmp1;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc;
  int test;
  __m128i cmp2;
  __m128i cmp1;
  __m128i coeffs;
  int zbin1_tmp;
  int zbin0_tmp;
  int eob;
  int i;
  int idx_arr [1024];
  int idx;
  __m128i nzbins [2];
  __m128i zbins [2];
  undefined8 local_1208;
  undefined8 uStack_1200;
  int local_11dc;
  int aiStack_11d8 [1027];
  int local_1cc;
  int local_1c8 [4];
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  long local_1a8 [4];
  long local_188;
  long local_180;
  long local_178;
  long local_168;
  long local_160;
  long local_158;
  undefined8 uStack_150;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  
  local_1cc = 0;
  sVar2 = -1;
  local_13c = *in_RDX + 2 >> 2;
  local_138 = in_RDX[1] + 2 >> 2;
  local_1a8[0] = CONCAT44(local_138,local_13c);
  local_1a8[1] = CONCAT44(local_138,local_138);
  local_1a8[2] = CONCAT44(local_138,local_138);
  local_1a8[3] = CONCAT44(local_138,local_138);
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_1c8[1] = -local_138;
  local_1c8[0] = -local_13c;
  local_1c8[3] = -local_138;
  local_1c8[2] = -local_138;
  local_d8 = 0;
  uStack_d0 = 0;
  _local_1b8 = CONCAT44(-local_138,-local_138);
  _iStack_1b0 = CONCAT44(-local_138,-local_138);
  local_188 = in_R9;
  local_180 = in_R8;
  local_178 = in_RCX;
  local_168 = in_RSI;
  local_160 = in_RDI;
  local_158 = local_1a8[0];
  uStack_150 = local_1a8[1];
  local_134 = local_138;
  local_130 = local_138;
  local_12c = local_138;
  local_128 = local_1a8[2];
  uStack_120 = local_1a8[3];
  local_118 = local_138;
  local_114 = local_138;
  local_110 = local_138;
  local_10c = local_138;
  local_e8 = local_1a8[2];
  uStack_e0 = local_1a8[3];
  local_c8 = local_1a8[0];
  uStack_c0 = local_1a8[1];
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(in_stack_00000010,0,local_168 << 2);
  for (local_11dc = 0; (long)local_11dc < local_168 / 4; local_11dc = local_11dc + 1) {
    puVar1 = (undefined8 *)(local_160 + (long)(local_11dc << 2) * 4);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    local_68 = (int)local_1a8[(ulong)(local_11dc != 0) * 2];
    iStack_64 = (int)((ulong)local_1a8[(ulong)(local_11dc != 0) * 2] >> 0x20);
    iStack_60 = (int)local_1a8[(ulong)(local_11dc != 0) * 2 + 1];
    iStack_5c = (int)((ulong)local_1a8[(ulong)(local_11dc != 0) * 2 + 1] >> 0x20);
    local_78 = (int)uVar4;
    iStack_74 = (int)((ulong)uVar4 >> 0x20);
    iStack_70 = (int)uVar5;
    iStack_6c = (int)((ulong)uVar5 >> 0x20);
    local_1208 = CONCAT44(-(uint)(iStack_74 < iStack_64),-(uint)(local_78 < local_68));
    uStack_1200 = CONCAT44(-(uint)(iStack_6c < iStack_5c),-(uint)(iStack_70 < iStack_60));
    local_58 = (int)*(undefined8 *)(local_1c8 + (ulong)(local_11dc != 0) * 4);
    iStack_54 = (int)((ulong)*(undefined8 *)(local_1c8 + (ulong)(local_11dc != 0) * 4) >> 0x20);
    iStack_50 = (int)*(undefined8 *)(local_1c8 + (ulong)(local_11dc != 0) * 4 + 2);
    iStack_4c = (int)((ulong)*(undefined8 *)(local_1c8 + (ulong)(local_11dc != 0) * 4 + 2) >> 0x20);
    uStack_1200 = uStack_1200 &
                  CONCAT44(-(uint)(iStack_4c < iStack_6c),-(uint)(iStack_50 < iStack_70));
    auVar6._8_8_ = uStack_1200;
    auVar6._0_8_ = local_1208 &
                   CONCAT44(-(uint)(iStack_54 < iStack_74),-(uint)(local_58 < local_78));
    if ((((auVar6 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      aiStack_11d8[local_1cc] = local_11dc << 2;
      local_1cc = local_1cc + 1;
    }
    if ((((auVar6 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      aiStack_11d8[local_1cc] = local_11dc * 4 + 1;
      local_1cc = local_1cc + 1;
    }
    if ((((uStack_1200 >> 7 & 1) == 0 && (uStack_1200 >> 0xf & 1) == 0) &&
        (uStack_1200 >> 0x17 & 1) == 0) && (uStack_1200 >> 0x1f & 1) == 0) {
      aiStack_11d8[local_1cc] = local_11dc * 4 + 2;
      local_1cc = local_1cc + 1;
    }
    if ((((uStack_1200 >> 0x27 & 1) == 0 && (uStack_1200 >> 0x2f & 1) == 0) &&
        (uStack_1200 >> 0x37 & 1) == 0) && -1 < (long)uStack_1200) {
      aiStack_11d8[local_1cc] = local_11dc * 4 + 3;
      local_1cc = local_1cc + 1;
    }
  }
  for (local_11dc = 0; local_11dc < local_1cc; local_11dc = local_11dc + 1) {
    iVar3 = aiStack_11d8[local_11dc];
    uVar8 = *(uint *)(local_160 + (long)iVar3 * 4);
    uVar7 = 0;
    if ((int)uVar8 < 0) {
      uVar7 = 0xffffffff;
    }
    lVar9 = (long)(int)(((uVar8 ^ uVar7) - uVar7) +
                       (*(short *)(local_178 + (long)(int)(uint)(iVar3 != 0) * 2) + 2 >> 2));
    uVar8 = (uint)(((lVar9 * *(short *)(local_180 + (long)(int)(uint)(iVar3 != 0) * 2) >> 0x10) +
                   lVar9) * (long)*(short *)(local_188 + (long)(int)(uint)(iVar3 != 0) * 2) >> 0xe);
    *(uint *)((long)in_stack_00000008 + (long)iVar3 * 4) = (uVar8 ^ uVar7) - uVar7;
    *(int *)((long)in_stack_00000010 + (long)iVar3 * 4) =
         (*(int *)((long)in_stack_00000008 + (long)iVar3 * 4) *
         (int)*(short *)(tmp2 + (long)(int)(uint)(iVar3 != 0) * 2)) / 4;
    if ((uVar8 != 0) && (sVar2 < *(short *)(_coeff_sign + (long)aiStack_11d8[local_11dc] * 2))) {
      sVar2 = *(short *)(_coeff_sign + (long)aiStack_11d8[local_11dc] * 2);
    }
  }
  *(short *)tmp1 = sVar2 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  __m128i zbins[2];
  __m128i nzbins[2];
  int idx = 0;
  int idx_arr[1024];
  int i, eob = -1;
  const int zbin0_tmp = ROUND_POWER_OF_TWO(zbin_ptr[0], 2);
  const int zbin1_tmp = ROUND_POWER_OF_TWO(zbin_ptr[1], 2);
  (void)scan;
  zbins[0] = _mm_set_epi32(zbin1_tmp, zbin1_tmp, zbin1_tmp, zbin0_tmp);
  zbins[1] = _mm_set1_epi32(zbin1_tmp);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs / 4; i++) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (!(test & 0xf)) idx_arr[idx++] = i * 4;
    if (!(test & 0xf0)) idx_arr[idx++] = i * 4 + 1;
    if (!(test & 0xf00)) idx_arr[idx++] = i * 4 + 2;
    if (!(test & 0xf000)) idx_arr[idx++] = i * 4 + 3;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = idx_arr[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 = abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], 2);
    const int64_t tmp2 = ((tmp1 * quant_ptr[rc != 0]) >> 16) + tmp1;
    const uint32_t abs_qcoeff =
        (uint32_t)((tmp2 * quant_shift_ptr[rc != 0]) >> 14);
    qcoeff_ptr[rc] = (int)(abs_qcoeff ^ (uint32_t)coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0] / 4;
    if (abs_qcoeff) eob = iscan[idx_arr[i]] > eob ? iscan[idx_arr[i]] : eob;
  }
  *eob_ptr = eob + 1;
}